

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf.c
# Opt level: O3

int resolve_unit_addrs_overlap_walk
              (backtrace_state *state,size_t *pfrom,size_t *pto,unit_addrs *enclosing,
              unit_addrs_vector *old_vec,backtrace_error_callback error_callback,void *data,
              unit_addrs_vector *new_vec)

{
  unit_addrs *enclosing_00;
  uintptr_t *puVar1;
  ulong uVar2;
  void *pvVar3;
  uintptr_t uVar4;
  int iVar5;
  void *pvVar6;
  ulong uVar7;
  undefined4 *puVar8;
  size_t sVar9;
  ulong uVar10;
  size_t sVar11;
  
  uVar2 = old_vec->count;
  sVar9 = *pto;
  if (*pfrom < uVar2) {
    pvVar3 = (old_vec->vec).base;
    pvVar6 = (new_vec->vec).base;
    uVar10 = *pfrom;
    do {
      enclosing_00 = (unit_addrs *)((long)pvVar3 + uVar10 * 0x18);
      if (enclosing == (unit_addrs *)0x0) {
        *(unit **)((long)pvVar6 + sVar9 * 0x18 + 0x10) = enclosing_00->u;
        uVar4 = enclosing_00->high;
        puVar1 = (uintptr_t *)((long)pvVar6 + sVar9 * 0x18);
        *puVar1 = enclosing_00->low;
        puVar1[1] = uVar4;
      }
      else {
        if (enclosing->high <= enclosing_00->low) {
          *pfrom = uVar10;
          *pto = sVar9;
          return 1;
        }
        *(unit **)((long)pvVar6 + sVar9 * 0x18 + 0x10) = enclosing_00->u;
        uVar4 = enclosing_00->high;
        puVar1 = (uintptr_t *)((long)pvVar6 + sVar9 * 0x18);
        *puVar1 = enclosing_00->low;
        puVar1[1] = uVar4;
        if ((enclosing_00->high < enclosing->high) && (enclosing_00->high < enclosing_00[1].low)) {
          pvVar6 = tcmalloc_backtrace_vector_grow(state,0x18,error_callback,data,&new_vec->vec);
          if (pvVar6 == (void *)0x0) goto LAB_0012f2ab;
          pvVar6 = (new_vec->vec).base;
          sVar9 = sVar9 + 1;
          *(uintptr_t *)((long)pvVar6 + sVar9 * 0x18) = enclosing_00->high;
          uVar7 = enclosing_00[1].low;
          if (enclosing->high < enclosing_00[1].low) {
            uVar7 = enclosing->high;
          }
          *(ulong *)((long)pvVar6 + sVar9 * 0x18 + 8) = uVar7;
          *(unit **)((long)pvVar6 + sVar9 * 0x18 + 0x10) = enclosing->u;
        }
      }
      sVar11 = uVar10 + 1;
      if (*(ulong *)((long)pvVar3 + uVar10 * 0x18 + 0x20) <
          *(ulong *)((long)pvVar3 + uVar10 * 0x18 + 8)) {
        *pfrom = sVar11;
        *pto = sVar9 + 1;
        iVar5 = resolve_unit_addrs_overlap_walk
                          (state,pfrom,pto,enclosing_00,old_vec,error_callback,data,new_vec);
        if (iVar5 == 0) goto LAB_0012f2ab;
        sVar11 = *pfrom;
        sVar9 = *pto - 1;
      }
      sVar9 = sVar9 + 1;
      uVar10 = sVar11;
    } while (sVar11 < uVar2);
  }
  iVar5 = 1;
  if (enclosing == (unit_addrs *)0x0) {
    puVar8 = (undefined4 *)
             tcmalloc_backtrace_vector_grow(state,0x18,error_callback,data,&new_vec->vec);
    if (puVar8 == (undefined4 *)0x0) {
LAB_0012f2ab:
      iVar5 = 0;
    }
    else {
      *puVar8 = 0xffffffff;
      puVar8[1] = 0xffffffff;
      puVar8[2] = 0xffffffff;
      puVar8[3] = 0xffffffff;
      *(undefined8 *)(puVar8 + 4) = 0;
      new_vec->count = sVar9;
    }
  }
  return iVar5;
}

Assistant:

static int
resolve_unit_addrs_overlap_walk (struct backtrace_state *state,
				 size_t *pfrom, size_t *pto,
				 struct unit_addrs *enclosing,
				 struct unit_addrs_vector *old_vec,
				 backtrace_error_callback error_callback,
				 void *data,
				 struct unit_addrs_vector *new_vec)
{
  struct unit_addrs *old_addrs;
  size_t old_count;
  struct unit_addrs *new_addrs;
  size_t from;
  size_t to;

  old_addrs = (struct unit_addrs *) old_vec->vec.base;
  old_count = old_vec->count;
  new_addrs = (struct unit_addrs *) new_vec->vec.base;

  for (from = *pfrom, to = *pto; from < old_count; from++, to++)
    {
      /* If we are in the scope of a larger range that can no longer
	 cover any further ranges, return back to the caller.  */

      if (enclosing != NULL
	  && enclosing->high <= old_addrs[from].low)
	{
	  *pfrom = from;
	  *pto = to;
	  return 1;
	}

      new_addrs[to] = old_addrs[from];

      /* If we are in scope of a larger range, fill in any gaps
	 between this entry and the next one.

	 There is an extra entry at the end of the vector, so it's
	 always OK to refer to from + 1.  */

      if (enclosing != NULL
	  && enclosing->high > old_addrs[from].high
	  && old_addrs[from].high < old_addrs[from + 1].low)
	{
	  void *grew;
	  size_t new_high;

	  grew = backtrace_vector_grow (state, sizeof (struct unit_addrs),
					error_callback, data, &new_vec->vec);
	  if (grew == NULL)
	    return 0;
	  new_addrs = (struct unit_addrs *) new_vec->vec.base;
	  to++;
	  new_addrs[to].low = old_addrs[from].high;
	  new_high = old_addrs[from + 1].low;
	  if (enclosing->high < new_high)
	    new_high = enclosing->high;
	  new_addrs[to].high = new_high;
	  new_addrs[to].u = enclosing->u;
	}

      /* If this range has a larger scope than the next one, use it to
	 fill in any gaps.  */

      if (old_addrs[from].high > old_addrs[from + 1].high)
	{
	  *pfrom = from + 1;
	  *pto = to + 1;
	  if (!resolve_unit_addrs_overlap_walk (state, pfrom, pto,
						&old_addrs[from], old_vec,
						error_callback, data, new_vec))
	    return 0;
	  from = *pfrom;
	  to = *pto;

	  /* Undo the increment the loop is about to do.  */
	  from--;
	  to--;
	}
    }

  if (enclosing == NULL)
    {
      struct unit_addrs *pa;

      /* Add trailing entry.  */

      pa = ((struct unit_addrs *)
	    backtrace_vector_grow (state, sizeof (struct unit_addrs),
				   error_callback, data, &new_vec->vec));
      if (pa == NULL)
	return 0;
      pa->low = 0;
      --pa->low;
      pa->high = pa->low;
      pa->u = NULL;

      new_vec->count = to;
    }

  return 1;
}